

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice_detection_impl.cc
# Opt level: O2

int __thiscall webrtc::VoiceDetectionImpl::set_frame_size_ms(VoiceDetectionImpl *this,int size)

{
  string *result;
  CritScope cs;
  FatalMessage local_188;
  
  rtc::CritScope::CritScope(&cs,this->crit_);
  result = rtc::CheckEQImpl_abi_cxx11_(10,size,"10 == size");
  if (result == (string *)0x0) {
    this->frame_size_ms_ = size;
    Initialize(this,this->sample_rate_hz_);
    rtc::CritScope::~CritScope(&cs);
    return 0;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/voice_detection_impl.cc"
             ,0x90,result);
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

int VoiceDetectionImpl::set_frame_size_ms(int size) {
  rtc::CritScope cs(crit_);
  RTC_DCHECK_EQ(10, size); // TODO(ajm): remove when supported.
  frame_size_ms_ = size;
  Initialize(sample_rate_hz_);
  return AudioProcessing::kNoError;
}